

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_zip.c
# Opt level: O0

uchar * cd_alloc(zip_conflict *zip,size_t length)

{
  cd_segment *__ptr;
  uchar *puVar1;
  cd_segment *segment;
  uchar *p;
  size_t length_local;
  zip_conflict *zip_local;
  
  if ((zip->central_directory == (cd_segment *)0x0) ||
     (zip->central_directory_last->buff + zip->central_directory_last->buff_size <
      zip->central_directory_last->p + length)) {
    __ptr = (cd_segment *)calloc(1,0x20);
    if (__ptr == (cd_segment *)0x0) {
      return (uchar *)0x0;
    }
    __ptr->buff_size = 0x10000;
    puVar1 = (uchar *)malloc(__ptr->buff_size);
    __ptr->buff = puVar1;
    if (__ptr->buff == (uchar *)0x0) {
      free(__ptr);
      return (uchar *)0x0;
    }
    __ptr->p = __ptr->buff;
    if (zip->central_directory == (cd_segment *)0x0) {
      zip->central_directory_last = __ptr;
      zip->central_directory = __ptr;
    }
    else {
      zip->central_directory_last->next = __ptr;
      zip->central_directory_last = __ptr;
    }
  }
  puVar1 = zip->central_directory_last->p;
  zip->central_directory_last->p = zip->central_directory_last->p + length;
  zip->central_directory_bytes = length + zip->central_directory_bytes;
  return puVar1;
}

Assistant:

static unsigned char *
cd_alloc(struct zip *zip, size_t length)
{
	unsigned char *p;

	if (zip->central_directory == NULL
	    || (zip->central_directory_last->p + length
		> zip->central_directory_last->buff + zip->central_directory_last->buff_size)) {
		struct cd_segment *segment = calloc(1, sizeof(*segment));
		if (segment == NULL)
			return NULL;
		segment->buff_size = 64 * 1024;
		segment->buff = malloc(segment->buff_size);
		if (segment->buff == NULL) {
			free(segment);
			return NULL;
		}
		segment->p = segment->buff;

		if (zip->central_directory == NULL) {
			zip->central_directory
			    = zip->central_directory_last
			    = segment;
		} else {
			zip->central_directory_last->next = segment;
			zip->central_directory_last = segment;
		}
	}

	p = zip->central_directory_last->p;
	zip->central_directory_last->p += length;
	zip->central_directory_bytes += length;
	return (p);
}